

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

size_t strlen_url(char *url)

{
  char cVar1;
  size_t sVar2;
  byte bVar3;
  long lVar4;
  
  bVar3 = 1;
  sVar2 = 0;
  do {
    cVar1 = *url;
    if (cVar1 == ' ') {
      lVar4 = (ulong)bVar3 * 2 + 1;
    }
    else {
      lVar4 = 1;
      if (cVar1 == '?') {
        bVar3 = 0;
      }
      else if (cVar1 == '\0') {
        return sVar2;
      }
    }
    sVar2 = sVar2 + lVar4;
    url = url + 1;
  } while( true );
}

Assistant:

static size_t strlen_url(const char *url)
{
  const char *ptr;
  size_t newlen=0;
  bool left=TRUE; /* left side of the ? */

  for(ptr=url; *ptr; ptr++) {
    switch(*ptr) {
    case '?':
      left=FALSE;
      /* fall through */
    default:
      newlen++;
      break;
    case ' ':
      if(left)
        newlen+=3;
      else
        newlen++;
      break;
    }
  }
  return newlen;
}